

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::TemplatedCustomNamer::getApprovedFile
          (string *__return_storage_ptr__,TemplatedCustomNamer *this,string *extensionWithDot)

{
  string sStack_78;
  Path local_58;
  
  ::std::__cxx11::string::string((string *)&sStack_78,(string *)extensionWithDot);
  getApprovedFileAsPath(&local_58,this,&sStack_78);
  Path::toString_abi_cxx11_(__return_storage_ptr__,&local_58);
  Path::~Path(&local_58);
  ::std::__cxx11::string::~string((string *)&sStack_78);
  return __return_storage_ptr__;
}

Assistant:

std::string TemplatedCustomNamer::getApprovedFile(std::string extensionWithDot) const
    {
        return getApprovedFileAsPath(extensionWithDot).toString();
    }